

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseChunk(xmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  xmlParserInputBufferPtr input;
  xmlGenericErrorFunc p_Var3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  xmlChar *pxVar7;
  xmlGenericErrorFunc *pp_Var8;
  void **ppvVar9;
  int local_8c;
  int cur_avail;
  size_t current_1;
  size_t base_2;
  size_t current;
  size_t base_1;
  int nbchars;
  xmlParserInputBufferPtr in;
  uint len;
  int res;
  size_t cur;
  size_t base;
  size_t avail;
  size_t old_avail;
  int remain;
  int end_in_lf;
  int terminate_local;
  int size_local;
  char *chunk_local;
  xmlParserCtxtPtr ctxt_local;
  
  bVar4 = false;
  avail = 0;
  base = 0;
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = 1;
  }
  else if ((ctxt->errNo == 0) || (ctxt->disableSAX != 1)) {
    if (ctxt->instate == XML_PARSER_EOF) {
      ctxt_local._4_4_ = -1;
    }
    else {
      if (ctxt->instate == XML_PARSER_START) {
        xmlDetectSAX2(ctxt);
      }
      end_in_lf = size;
      _terminate_local = chunk;
      if ((((0 < size) && (chunk != (char *)0x0)) && (terminate == 0)) && (chunk[size + -1] == '\r')
         ) {
        bVar4 = true;
        end_in_lf = size + -1;
      }
      while( true ) {
        old_avail._0_4_ = 0;
        if (((end_in_lf < 1) || (_terminate_local == (char *)0x0)) ||
           ((ctxt->input == (xmlParserInputPtr)0x0 ||
            ((ctxt->input->buf == (xmlParserInputBufferPtr)0x0 || (ctxt->instate == XML_PARSER_EOF))
            )))) {
          if (((ctxt->instate != XML_PARSER_EOF) &&
              (((ctxt->input != (xmlParserInputPtr)0x0 &&
                (ctxt->input->buf != (xmlParserInputBufferPtr)0x0)) &&
               (input = ctxt->input->buf, input->encoder != (xmlCharEncodingHandlerPtr)0x0)))) &&
             ((input->buffer != (xmlBufPtr)0x0 && (input->raw != (xmlBufPtr)0x0)))) {
            sVar6 = xmlBufGetInputBase(input->buffer,ctxt->input);
            pxVar1 = ctxt->input->cur;
            pxVar2 = ctxt->input->base;
            iVar5 = xmlCharEncInput(input,terminate);
            xmlBufSetInputBaseCur(input->buffer,ctxt->input,sVar6,(long)pxVar1 - (long)pxVar2);
            if (iVar5 < 0) {
              pp_Var8 = __xmlGenericError();
              p_Var3 = *pp_Var8;
              ppvVar9 = __xmlGenericErrorContext();
              (*p_Var3)(*ppvVar9,"xmlParseChunk: encoder error\n");
              xmlHaltParser(ctxt);
              return 0x51;
            }
          }
        }
        else {
          sVar6 = xmlBufGetInputBase(ctxt->input->buf->buffer,ctxt->input);
          pxVar1 = ctxt->input->cur;
          pxVar2 = ctxt->input->base;
          avail = xmlBufUse(ctxt->input->buf->buffer);
          if (((ctxt->instate == XML_PARSER_START) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
             ((ctxt->input->buf != (xmlParserInputBufferPtr)0x0 &&
              (ctxt->input->buf->encoder != (xmlCharEncodingHandlerPtr)0x0)))) {
            in._0_4_ = 0x2d;
            pxVar7 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,(xmlChar *)"UTF-16");
            if ((pxVar7 == (xmlChar *)0x0) &&
               (pxVar7 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,(xmlChar *)"UTF16"
                                      ), pxVar7 == (xmlChar *)0x0)) {
              pxVar7 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,"UCS-4");
              if ((pxVar7 != (xmlChar *)0x0) ||
                 (pxVar7 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,
                                         (xmlChar *)"UCS4"), pxVar7 != (xmlChar *)0x0)) {
                in._0_4_ = 0xb4;
              }
            }
            else {
              in._0_4_ = 0x5a;
            }
            if (ctxt->input->buf->rawconsumed < (ulong)(uint)in) {
              in._0_4_ = (uint)in - (int)ctxt->input->buf->rawconsumed;
            }
            if ((uint)in < (uint)end_in_lf) {
              old_avail._0_4_ = end_in_lf - (uint)in;
              end_in_lf = (uint)in;
            }
            else {
              old_avail._0_4_ = 0;
            }
          }
          iVar5 = xmlParserInputBufferPush(ctxt->input->buf,end_in_lf,_terminate_local);
          xmlBufSetInputBaseCur
                    (ctxt->input->buf->buffer,ctxt->input,sVar6,(long)pxVar1 - (long)pxVar2);
          if (iVar5 < 0) {
            ctxt->errNo = -1;
            xmlHaltParser(ctxt);
            return -1;
          }
        }
        if ((int)old_avail == 0) {
          if ((ctxt->input != (xmlParserInputPtr)0x0) &&
             (ctxt->input->buf != (xmlParserInputBufferPtr)0x0)) {
            base = xmlBufUse(ctxt->input->buf->buffer);
          }
          if ((((terminate != 0) || (10000000 < base)) || (avail == 0)) ||
             ((base == 0 ||
              (iVar5 = xmlParseCheckTransition
                                 (ctxt,(char *)(ctxt->input->base + avail),(int)base - (int)avail),
              iVar5 != 0)))) {
            xmlParseTryOrFinish(ctxt,terminate);
          }
        }
        else {
          xmlParseTryOrFinish(ctxt,0);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return ctxt->errNo;
        }
        if (((ctxt->input != (xmlParserInputPtr)0x0) &&
            ((10000000 < (long)ctxt->input->end - (long)ctxt->input->cur ||
             (10000000 < (long)ctxt->input->cur - (long)ctxt->input->base)))) &&
           ((ctxt->options & 0x80000U) == 0)) {
          xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"Huge input lookup");
          xmlHaltParser(ctxt);
        }
        if ((ctxt->errNo != 0) && (ctxt->disableSAX == 1)) {
          return ctxt->errNo;
        }
        if ((int)old_avail == 0) break;
        _terminate_local = _terminate_local + end_in_lf;
        end_in_lf = (int)old_avail;
      }
      if (((bVar4) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
         (ctxt->input->buf != (xmlParserInputBufferPtr)0x0)) {
        sVar6 = xmlBufGetInputBase(ctxt->input->buf->buffer,ctxt->input);
        pxVar1 = ctxt->input->cur;
        pxVar2 = ctxt->input->base;
        xmlParserInputBufferPush(ctxt->input->buf,1,"\r");
        xmlBufSetInputBaseCur
                  (ctxt->input->buf->buffer,ctxt->input,sVar6,(long)pxVar1 - (long)pxVar2);
      }
      if (terminate != 0) {
        local_8c = 0;
        if (ctxt->input != (xmlParserInputPtr)0x0) {
          if (ctxt->input->buf == (xmlParserInputBufferPtr)0x0) {
            local_8c = ctxt->input->length - ((int)ctxt->input->cur - (int)ctxt->input->base);
          }
          else {
            sVar6 = xmlBufUse(ctxt->input->buf->buffer);
            local_8c = (int)sVar6 - ((int)ctxt->input->cur - (int)ctxt->input->base);
          }
        }
        if ((ctxt->instate != XML_PARSER_EOF) && (ctxt->instate != XML_PARSER_EPILOG)) {
          xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
        }
        if ((ctxt->instate == XML_PARSER_EPILOG) && (0 < local_8c)) {
          xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
        }
        if (((ctxt->instate != XML_PARSER_EOF) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
           (ctxt->sax->endDocument != (endDocumentSAXFunc)0x0)) {
          (*ctxt->sax->endDocument)(ctxt->userData);
        }
        ctxt->instate = XML_PARSER_EOF;
      }
      if (ctxt->wellFormed == 0) {
        ctxt_local._4_4_ = ctxt->errNo;
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  else {
    ctxt_local._4_4_ = ctxt->errNo;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParseChunk(xmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    int end_in_lf = 0;
    int remain = 0;
    size_t old_avail = 0;
    size_t avail = 0;

    if (ctxt == NULL)
        return(XML_ERR_INTERNAL_ERROR);
    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX == 1))
        return(ctxt->errNo);
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    if (ctxt->instate == XML_PARSER_START)
        xmlDetectSAX2(ctxt);
    if ((size > 0) && (chunk != NULL) && (!terminate) &&
        (chunk[size - 1] == '\r')) {
	end_in_lf = 1;
	size--;
    }

xmldecl_done:

    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

        old_avail = xmlBufUse(ctxt->input->buf->buffer);
        /*
         * Specific handling if we autodetected an encoding, we should not
         * push more than the first line ... which depend on the encoding
         * And only push the rest once the final encoding was detected
         */
        if ((ctxt->instate == XML_PARSER_START) && (ctxt->input != NULL) &&
            (ctxt->input->buf != NULL) && (ctxt->input->buf->encoder != NULL)) {
            unsigned int len = 45;

            if ((xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                               BAD_CAST "UTF-16")) ||
                (xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                               BAD_CAST "UTF16")))
                len = 90;
            else if ((xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                                    BAD_CAST "UCS-4")) ||
                     (xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                                    BAD_CAST "UCS4")))
                len = 180;

            if (ctxt->input->buf->rawconsumed < len)
                len -= ctxt->input->buf->rawconsumed;

            /*
             * Change size for reading the initial declaration only
             * if size is greater than len. Otherwise, memmove in xmlBufferAdd
             * will blindly copy extra bytes from memory.
             */
            if ((unsigned int) size > len) {
                remain = size - len;
                size = len;
            } else {
                remain = 0;
            }
        }
	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    xmlHaltParser(ctxt);
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "PP: pushed %d\n", size);
#endif

    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    /* TODO 2.6.0 */
		    xmlGenericError(xmlGenericErrorContext,
				    "xmlParseChunk: encoder error\n");
                    xmlHaltParser(ctxt);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    if (remain != 0) {
        xmlParseTryOrFinish(ctxt, 0);
    } else {
        if ((ctxt->input != NULL) && (ctxt->input->buf != NULL))
            avail = xmlBufUse(ctxt->input->buf->buffer);
        /*
         * Depending on the current state it may not be such
         * a good idea to try parsing if there is nothing in the chunk
         * which would be worth doing a parser state transition and we
         * need to wait for more data
         */
        if ((terminate) || (avail > XML_MAX_TEXT_LENGTH) ||
            (old_avail == 0) || (avail == 0) ||
            (xmlParseCheckTransition(ctxt,
                       (const char *)&ctxt->input->base[old_avail],
                                     avail - old_avail)))
            xmlParseTryOrFinish(ctxt, terminate);
    }
    if (ctxt->instate == XML_PARSER_EOF)
        return(ctxt->errNo);

    if ((ctxt->input != NULL) &&
         (((ctxt->input->end - ctxt->input->cur) > XML_MAX_LOOKUP_LIMIT) ||
         ((ctxt->input->cur - ctxt->input->base) > XML_MAX_LOOKUP_LIMIT)) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR, "Huge input lookup");
        xmlHaltParser(ctxt);
    }
    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX == 1))
        return(ctxt->errNo);

    if (remain != 0) {
        chunk += size;
        size = remain;
        remain = 0;
        goto xmldecl_done;
    }
    if ((end_in_lf == 1) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL)) {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer,
					 ctxt->input);
	size_t current = ctxt->input->cur - ctxt->input->base;

	xmlParserInputBufferPush(ctxt->input->buf, 1, "\r");

	xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input,
			      base, current);
    }
    if (terminate) {
	/*
	 * Check for termination
	 */
	int cur_avail = 0;

	if (ctxt->input != NULL) {
	    if (ctxt->input->buf == NULL)
		cur_avail = ctxt->input->length -
			    (ctxt->input->cur - ctxt->input->base);
	    else
		cur_avail = xmlBufUse(ctxt->input->buf->buffer) -
			              (ctxt->input->cur - ctxt->input->base);
	}

	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG)) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	if ((ctxt->instate == XML_PARSER_EPILOG) && (cur_avail > 0)) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    if (ctxt->wellFormed == 0)
	return((xmlParserErrors) ctxt->errNo);
    else
        return(0);
}